

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavUpdateCreateMoveRequest(void)

{
  ImGuiWindow *this;
  ImGuiContext_conflict *pIVar1;
  _Bool _Var2;
  ImGuiIO *pIVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  float lhs;
  ImVec2 local_b8;
  ImVec2 local_b0;
  ImRect local_a8;
  undefined1 local_98 [8];
  ImRect nav_rect_rel;
  ImRect scoring_rect;
  float pad;
  ImVec2 local_64;
  ImVec2 local_5c;
  ImVec2 local_54;
  ImVec2 local_4c;
  ImVec2 local_44;
  undefined1 local_3c [8];
  ImRect window_rect_rel;
  float scoring_rect_offset_y;
  _Bool nav_keyboard_active;
  ImGuiInputReadMode read_mode;
  ImGuiWindow_conflict *window;
  ImGuiIO *io;
  ImGuiContext_conflict *g;
  
  pIVar1 = GImGui;
  pIVar3 = &GImGui->IO;
  this = (ImGuiWindow *)GImGui->NavWindow;
  if (((GImGui->NavMoveForwardToNextFrame & 1U) == 0) || (this == (ImGuiWindow *)0x0)) {
    GImGui->NavMoveDir = -1;
    pIVar1->NavMoveFlags = 0;
    pIVar1->NavMoveScrollFlags = 0;
    if (((this != (ImGuiWindow *)0x0) && (pIVar1->NavWindowingTarget == (ImGuiWindow_conflict *)0x0)
        ) && ((this->Flags & 0x40000U) == 0)) {
      _Var2 = IsActiveIdUsingNavDir(0);
      if ((!_Var2) &&
         ((_Var2 = IsNavInputTest(4,ImGuiInputReadMode_Repeat), _Var2 ||
          (_Var2 = IsNavInputTest(0x10,ImGuiInputReadMode_Repeat), _Var2)))) {
        pIVar1->NavMoveDir = 0;
      }
      _Var2 = IsActiveIdUsingNavDir(1);
      if ((!_Var2) &&
         ((_Var2 = IsNavInputTest(5,ImGuiInputReadMode_Repeat), _Var2 ||
          (_Var2 = IsNavInputTest(0x11,ImGuiInputReadMode_Repeat), _Var2)))) {
        pIVar1->NavMoveDir = 1;
      }
      _Var2 = IsActiveIdUsingNavDir(2);
      if ((!_Var2) &&
         ((_Var2 = IsNavInputTest(6,ImGuiInputReadMode_Repeat), _Var2 ||
          (_Var2 = IsNavInputTest(0x12,ImGuiInputReadMode_Repeat), _Var2)))) {
        pIVar1->NavMoveDir = 2;
      }
      _Var2 = IsActiveIdUsingNavDir(3);
      if ((!_Var2) &&
         ((_Var2 = IsNavInputTest(7,ImGuiInputReadMode_Repeat), _Var2 ||
          (_Var2 = IsNavInputTest(0x13,ImGuiInputReadMode_Repeat), _Var2)))) {
        pIVar1->NavMoveDir = 3;
      }
    }
    pIVar1->NavMoveClipDir = pIVar1->NavMoveDir;
  }
  else {
    bVar4 = false;
    if (GImGui->NavMoveDir != -1) {
      bVar4 = GImGui->NavMoveClipDir != -1;
    }
    if (!bVar4) {
      __assert_fail("g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                    ,0x278e,"void ImGui::NavUpdateCreateMoveRequest()");
    }
    if ((GImGui->NavMoveFlags & 0x80U) == 0) {
      __assert_fail("g.NavMoveFlags & ImGuiNavMoveFlags_Forwarded",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                    ,0x278f,"void ImGui::NavUpdateCreateMoveRequest()");
    }
  }
  window_rect_rel.Max.y._3_1_ = (pIVar3->ConfigFlags & 1U) != 0;
  window_rect_rel.Max.x = 0.0;
  if (((this != (ImGuiWindow *)0x0) && (pIVar1->NavMoveDir == -1)) &&
     ((bool)window_rect_rel.Max.y._3_1_)) {
    window_rect_rel.Max.x = NavUpdatePageUpPageDown();
  }
  pIVar1->NavMoveForwardToNextFrame = false;
  if (pIVar1->NavMoveDir != -1) {
    NavMoveRequestSubmit
              (pIVar1->NavMoveDir,pIVar1->NavMoveClipDir,pIVar1->NavMoveFlags,
               pIVar1->NavMoveScrollFlags);
  }
  if (((pIVar1->NavMoveSubmitted & 1U) != 0) && (pIVar1->NavId == 0)) {
    pIVar1->NavInitRequestFromMove = true;
    pIVar1->NavInitRequest = true;
    pIVar1->NavInitResultId = 0;
    pIVar1->NavDisableHighlight = false;
  }
  if ((((pIVar1->NavMoveSubmitted & 1U) != 0) &&
      (pIVar1->NavInputSource == ImGuiInputSource_Gamepad)) &&
     ((pIVar1->NavLayer == ImGuiNavLayer_Main && (this != (ImGuiWindow *)0x0)))) {
    local_4c = operator-(&(this->InnerRect).Min,&this->Pos);
    ImVec2::ImVec2(&local_54,1.0,1.0);
    local_44 = operator-(&local_4c,&local_54);
    local_64 = operator-(&(this->InnerRect).Max,&this->Pos);
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff94,1.0,1.0);
    local_5c = operator+(&local_64,(ImVec2 *)&stack0xffffffffffffff94);
    ImRect::ImRect((ImRect *)local_3c,&local_44,&local_5c);
    _Var2 = ImRect::Contains((ImRect *)local_3c,this->NavRectRel + pIVar1->NavLayer);
    if (!_Var2) {
      fVar5 = ImGuiWindow::CalcFontSize(this);
      fVar6 = ImRect::GetWidth((ImRect *)local_3c);
      fVar6 = ImMin<float>(fVar6,fVar5 * 0.5);
      lhs = ImRect::GetHeight((ImRect *)local_3c);
      fVar5 = ImMin<float>(lhs,fVar5 * 0.5);
      ImVec2::ImVec2(&scoring_rect.Max,-fVar6,-fVar5);
      ImRect::Expand((ImRect *)local_3c,&scoring_rect.Max);
      ImRect::ClipWithFull(this->NavRectRel + pIVar1->NavLayer,(ImRect *)local_3c);
      pIVar1->NavFocusScopeId = 0;
      pIVar1->NavId = 0;
    }
  }
  ImRect::ImRect((ImRect *)&nav_rect_rel.Max);
  if (this != (ImGuiWindow *)0x0) {
    _Var2 = ImRect::IsInverted(this->NavRectRel + pIVar1->NavLayer);
    if (_Var2) {
      ImRect::ImRect((ImRect *)local_98,0.0,0.0,0.0,0.0);
    }
    else {
      local_98 = *(undefined1 (*) [8])&this->NavRectRel[pIVar1->NavLayer].Min;
      nav_rect_rel.Min = (&this->NavRectRel[pIVar1->NavLayer].Min)[1];
    }
    local_b0 = operator+(&this->Pos,(ImVec2 *)local_98);
    local_b8 = operator+(&this->Pos,&nav_rect_rel.Min);
    ImRect::ImRect(&local_a8,&local_b0,&local_b8);
    nav_rect_rel.Max = local_a8.Min;
    scoring_rect.Min = local_a8.Max;
    ImRect::TranslateY((ImRect *)&nav_rect_rel.Max,window_rect_rel.Max.x);
    fVar5 = ImMin<float>(nav_rect_rel.Max.x + 1.0,scoring_rect.Min.x);
    nav_rect_rel.Max.x = fVar5;
    scoring_rect.Min.x = fVar5;
    _Var2 = ImRect::IsInverted((ImRect *)&nav_rect_rel.Max);
    if (((_Var2 ^ 0xffU) & 1) == 0) {
      __assert_fail("!scoring_rect.IsInverted()",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                    ,0x27dc,"void ImGui::NavUpdateCreateMoveRequest()");
    }
  }
  (pIVar1->NavScoringRect).Min = nav_rect_rel.Max;
  (pIVar1->NavScoringRect).Max = scoring_rect.Min;
  return;
}

Assistant:

void ImGui::NavUpdateCreateMoveRequest()
{
    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;
    ImGuiWindow* window = g.NavWindow;

    if (g.NavMoveForwardToNextFrame && window != NULL)
    {
        // Forwarding previous request (which has been modified, e.g. wrap around menus rewrite the requests with a starting rectangle at the other side of the window)
        // (preserve most state, which were already set by the NavMoveRequestForward() function)
        IM_ASSERT(g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None);
        IM_ASSERT(g.NavMoveFlags & ImGuiNavMoveFlags_Forwarded);
        IMGUI_DEBUG_LOG_NAV("[nav] NavMoveRequestForward %d\n", g.NavMoveDir);
    }
    else
    {
        // Initiate directional inputs request
        g.NavMoveDir = ImGuiDir_None;
        g.NavMoveFlags = ImGuiNavMoveFlags_None;
        g.NavMoveScrollFlags = ImGuiScrollFlags_None;
        if (window && !g.NavWindowingTarget && !(window->Flags & ImGuiWindowFlags_NoNavInputs))
        {
            const ImGuiInputReadMode read_mode = ImGuiInputReadMode_Repeat;
            if (!IsActiveIdUsingNavDir(ImGuiDir_Left)  && (IsNavInputTest(ImGuiNavInput_DpadLeft,  read_mode) || IsNavInputTest(ImGuiNavInput_KeyLeft_,  read_mode))) { g.NavMoveDir = ImGuiDir_Left; }
            if (!IsActiveIdUsingNavDir(ImGuiDir_Right) && (IsNavInputTest(ImGuiNavInput_DpadRight, read_mode) || IsNavInputTest(ImGuiNavInput_KeyRight_, read_mode))) { g.NavMoveDir = ImGuiDir_Right; }
            if (!IsActiveIdUsingNavDir(ImGuiDir_Up)    && (IsNavInputTest(ImGuiNavInput_DpadUp,    read_mode) || IsNavInputTest(ImGuiNavInput_KeyUp_,    read_mode))) { g.NavMoveDir = ImGuiDir_Up; }
            if (!IsActiveIdUsingNavDir(ImGuiDir_Down)  && (IsNavInputTest(ImGuiNavInput_DpadDown,  read_mode) || IsNavInputTest(ImGuiNavInput_KeyDown_,  read_mode))) { g.NavMoveDir = ImGuiDir_Down; }
        }
        g.NavMoveClipDir = g.NavMoveDir;
    }

    // Update PageUp/PageDown/Home/End scroll
    // FIXME-NAV: Consider enabling those keys even without the master ImGuiConfigFlags_NavEnableKeyboard flag?
    const bool nav_keyboard_active = (io.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) != 0;
    float scoring_rect_offset_y = 0.0f;
    if (window && g.NavMoveDir == ImGuiDir_None && nav_keyboard_active)
        scoring_rect_offset_y = NavUpdatePageUpPageDown();

    // [DEBUG] Always send a request
#if IMGUI_DEBUG_NAV_SCORING
    if (io.KeyCtrl && IsKeyPressedMap(ImGuiKey_C))
        g.NavMoveDirForDebug = (ImGuiDir)((g.NavMoveDirForDebug + 1) & 3);
    if (io.KeyCtrl && g.NavMoveDir == ImGuiDir_None)
    {
        g.NavMoveDir = g.NavMoveDirForDebug;
        g.NavMoveFlags |= ImGuiNavMoveFlags_DebugNoResult;
    }
#endif

    // Submit
    g.NavMoveForwardToNextFrame = false;
    if (g.NavMoveDir != ImGuiDir_None)
        NavMoveRequestSubmit(g.NavMoveDir, g.NavMoveClipDir, g.NavMoveFlags, g.NavMoveScrollFlags);

    // Moving with no reference triggers a init request (will be used as a fallback if the direction fails to find a match)
    if (g.NavMoveSubmitted && g.NavId == 0)
    {
        IMGUI_DEBUG_LOG_NAV("[nav] NavInitRequest: from move, window \"%s\", layer=%d\n", g.NavWindow->Name, g.NavLayer);
        g.NavInitRequest = g.NavInitRequestFromMove = true;
        g.NavInitResultId = 0;
        g.NavDisableHighlight = false;
    }

    // When using gamepad, we project the reference nav bounding box into window visible area.
    // This is to allow resuming navigation inside the visible area after doing a large amount of scrolling, since with gamepad every movements are relative
    // (can't focus a visible object like we can with the mouse).
    if (g.NavMoveSubmitted && g.NavInputSource == ImGuiInputSource_Gamepad && g.NavLayer == ImGuiNavLayer_Main && window != NULL)
    {
        ImRect window_rect_rel(window->InnerRect.Min - window->Pos - ImVec2(1, 1), window->InnerRect.Max - window->Pos + ImVec2(1, 1));
        if (!window_rect_rel.Contains(window->NavRectRel[g.NavLayer]))
        {
            IMGUI_DEBUG_LOG_NAV("[nav] NavMoveRequest: clamp NavRectRel\n");
            float pad = window->CalcFontSize() * 0.5f;
            window_rect_rel.Expand(ImVec2(-ImMin(window_rect_rel.GetWidth(), pad), -ImMin(window_rect_rel.GetHeight(), pad))); // Terrible approximation for the intent of starting navigation from first fully visible item
            window->NavRectRel[g.NavLayer].ClipWithFull(window_rect_rel);
            g.NavId = g.NavFocusScopeId = 0;
        }
    }

    // For scoring we use a single segment on the left side our current item bounding box (not touching the edge to avoid box overlap with zero-spaced items)
    ImRect scoring_rect;
    if (window != NULL)
    {
        ImRect nav_rect_rel = !window->NavRectRel[g.NavLayer].IsInverted() ? window->NavRectRel[g.NavLayer] : ImRect(0, 0, 0, 0);
        scoring_rect = ImRect(window->Pos + nav_rect_rel.Min, window->Pos + nav_rect_rel.Max);
        scoring_rect.TranslateY(scoring_rect_offset_y);
        scoring_rect.Min.x = ImMin(scoring_rect.Min.x + 1.0f, scoring_rect.Max.x);
        scoring_rect.Max.x = scoring_rect.Min.x;
        IM_ASSERT(!scoring_rect.IsInverted()); // Ensure if we have a finite, non-inverted bounding box here will allows us to remove extraneous ImFabs() calls in NavScoreItem().
        //GetForegroundDrawList()->AddRect(scoring_rect.Min, scoring_rect.Max, IM_COL32(255,200,0,255)); // [DEBUG]
    }
    g.NavScoringRect = scoring_rect;
}